

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_uint64_field
          (OneofWellKnownTypes *this,UInt64Value *uint64_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  UInt64Value *uint64_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (uint64_field != (UInt64Value *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)uint64_field);
    message_arena = (Arena *)uint64_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::UInt64Value>
                              (message_arena_00,uint64_field,submessage_arena_00);
    }
    set_has_uint64_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_uint64_field(::google::protobuf::UInt64Value* PROTOBUF_NULLABLE uint64_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (uint64_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(uint64_field)->GetArena();
    if (message_arena != submessage_arena) {
      uint64_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, uint64_field, submessage_arena);
    }
    set_has_uint64_field();
    _impl_.oneof_field_.uint64_field_ = uint64_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.uint64_field)
}